

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.h
# Opt level: O0

shared_ptr<gui::DialogBoxStyle> __thiscall
gui::Theme::getStyle<gui::DialogBoxStyle>(Theme *this,String *widgetName)

{
  shared_ptr<gui::Style> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::DialogBoxStyle> sVar1;
  String *in_stack_00000090;
  Theme *in_stack_00000098;
  
  getStyle(in_stack_00000098,in_stack_00000090);
  std::dynamic_pointer_cast<gui::DialogBoxStyle,gui::Style>(in_RDX);
  std::shared_ptr<gui::Style>::~shared_ptr((shared_ptr<gui::Style> *)0x195ddb);
  sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::DialogBoxStyle>)
         sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getStyle(const sf::String& widgetName) const {
        return std::dynamic_pointer_cast<T>(getStyle(widgetName));
    }